

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderCommonFunctionTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::CommonFunctionCase::~CommonFunctionCase(CommonFunctionCase *this)

{
  code *pcVar1;
  CommonFunctionCase *this_local;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

CommonFunctionCase::~CommonFunctionCase (void)
{
	CommonFunctionCase::deinit();
}